

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial_test.hpp
# Opt level: O2

void TestKLPConstructorCimod<unsigned_long,double>
               (Polynomial<unsigned_long,_double> *polynomial,string *type)

{
  bool bVar1;
  uint uVar2;
  runtime_error *this;
  _Vector_base<int,_std::allocator<int>_> _Stack_2a88;
  Binaries init_spins;
  Polynomial<double> local_2a58;
  KLocalPolynomial<openjij::graph::Polynomial<double>_> system;
  BinaryPolynomialModel<unsigned_long,_double> bpm_cimod;
  mt19937 mt;
  random_device rnd;
  
  cimod::BinaryPolynomialModel<unsigned_long,_double>::BinaryPolynomialModel
            (&bpm_cimod,polynomial,BINARY);
  std::random_device::random_device(&rnd);
  uVar2 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&mt,(ulong)uVar2);
  system.num_interactions_ =
       (int64_t)&system.zero_count_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  system.num_binaries = 3;
  system.rate_call_k_local = 0;
  system._12_4_ = 0;
  system.count_call_updater = 0;
  system.binaries.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  system.binaries.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  system.binaries.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  system.vartype = SPIN;
  system._52_4_ = 0;
  system.dE_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x1;
  system.dE_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  system.dE_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  system.zero_count_.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
  ._M_start._0_4_ = 0x3f800000;
  system.zero_count_.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  system.zero_count_.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  openjij::graph::Graph::
  gen_binary<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (&init_spins,(Graph *)&system,&mt);
  openjij::graph::Polynomial<double>::~Polynomial((Polynomial<double> *)&system);
  cimod::BinaryPolynomialModel<unsigned_long,double>::ToSerializable_abi_cxx11_
            ((BinaryPolynomialModel<unsigned_long,double> *)&local_2a58);
  openjij::system::KLocalPolynomial<openjij::graph::Polynomial<double>_>::KLocalPolynomial
            (&system,&init_spins,(json *)&local_2a58);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&local_2a58);
  bVar1 = std::operator==(type,"Dense");
  if (bVar1) {
    TestKLPSystemDense<double>(&system);
    local_2a58.poly_key_inv_._M_h._M_buckets = &local_2a58.poly_key_inv_._M_h._M_single_bucket;
    local_2a58.super_Graph._num_spins = 3;
    local_2a58.poly_key_list_.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2a58.poly_key_list_.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2a58.poly_key_list_.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2a58.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2a58.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2a58.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2a58.poly_key_inv_._M_h._M_bucket_count = 1;
    local_2a58.poly_key_inv_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_2a58.poly_key_inv_._M_h._M_element_count = 0;
    local_2a58.poly_key_inv_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_2a58.poly_key_inv_._M_h._M_rehash_policy._M_next_resize = 0;
    local_2a58.poly_key_inv_._M_h._M_single_bucket = (__node_base_ptr)0x0;
    openjij::graph::Graph::
    gen_binary<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
              ((Binaries *)&_Stack_2a88,&local_2a58.super_Graph,&mt);
    openjij::system::KLocalPolynomial<openjij::graph::Polynomial<double>_>::reset_binaries
              (&system,(Binaries *)&_Stack_2a88);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&_Stack_2a88);
    openjij::graph::Polynomial<double>::~Polynomial(&local_2a58);
    TestKLPSystemDense<double>(&system);
  }
  else {
    bVar1 = std::operator==(type,"Sparse");
    if (!bVar1) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Unknown type");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    TestKLPSystemSparse<double>(&system);
    local_2a58.poly_key_inv_._M_h._M_buckets = &local_2a58.poly_key_inv_._M_h._M_single_bucket;
    local_2a58.super_Graph._num_spins = 3;
    local_2a58.poly_key_list_.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2a58.poly_key_list_.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2a58.poly_key_list_.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2a58.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2a58.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2a58.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2a58.poly_key_inv_._M_h._M_bucket_count = 1;
    local_2a58.poly_key_inv_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_2a58.poly_key_inv_._M_h._M_element_count = 0;
    local_2a58.poly_key_inv_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_2a58.poly_key_inv_._M_h._M_rehash_policy._M_next_resize = 0;
    local_2a58.poly_key_inv_._M_h._M_single_bucket = (__node_base_ptr)0x0;
    openjij::graph::Graph::
    gen_binary<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
              ((Binaries *)&_Stack_2a88,&local_2a58.super_Graph,&mt);
    openjij::system::KLocalPolynomial<openjij::graph::Polynomial<double>_>::reset_binaries
              (&system,(Binaries *)&_Stack_2a88);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&_Stack_2a88);
    openjij::graph::Polynomial<double>::~Polynomial(&local_2a58);
    TestKLPSystemSparse<double>(&system);
  }
  openjij::system::KLocalPolynomial<openjij::graph::Polynomial<double>_>::~KLocalPolynomial(&system)
  ;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&init_spins.super__Vector_base<int,_std::allocator<int>_>);
  std::random_device::~random_device(&rnd);
  cimod::BinaryPolynomialModel<unsigned_long,_double>::~BinaryPolynomialModel(&bpm_cimod);
  return;
}

Assistant:

void TestKLPConstructorCimod(const cimod::Polynomial<IndexType, FloatType> &polynomial, std::string type) {
   cimod::BinaryPolynomialModel<IndexType, FloatType> bpm_cimod(polynomial, cimod::Vartype::BINARY);
   std::random_device rnd;
   std::mt19937 mt(rnd());
   openjij::graph::Binaries init_spins = openjij::graph::Polynomial<FloatType>(3).gen_binary(mt);
   
   auto system = openjij::system::make_k_local_polynomial(init_spins, bpm_cimod.ToSerializable());
   if (type == "Dense") {
      TestKLPSystemDense(system);
      system.reset_binaries(openjij::graph::Polynomial<FloatType>(3).gen_binary(mt));
      TestKLPSystemDense(system);
   }
   else if (type == "Sparse") {
      TestKLPSystemSparse(system);
      system.reset_binaries(openjij::graph::Polynomial<FloatType>(3).gen_binary(mt));
      TestKLPSystemSparse(system);
   }
   else {
      throw std::runtime_error("Unknown type");
   }
}